

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O2

int taylor_compare<double,1,6>(taylor<double,_1,_6> *t1,taylor<double,_1,_6> *t2,num_t thres)

{
  double *pdVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  int i;
  ostringstream errmsg;
  ostringstream message;
  allocator local_40e;
  allocator local_40d;
  allocator local_40c;
  allocator local_40b;
  allocator local_40a;
  allocator local_409;
  double local_408;
  ulong uStack_400;
  num_t local_3f0;
  string local_3e8;
  double local_3c8;
  undefined8 uStack_3c0;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  ostringstream local_310 [376];
  ostringstream local_198 [376];
  
  i = 0;
  local_3f0 = thres;
  while( true ) {
    if (i == 7) {
      return 0;
    }
    pdVar1 = taylor<double,_1,_6>::operator[](t1,i);
    local_408 = *pdVar1;
    uStack_400 = 0;
    pdVar1 = taylor<double,_1,_6>::operator[](t2,i);
    uStack_400 = uStack_400 & 0x7fffffffffffffff;
    local_408 = ABS(local_408 - *pdVar1) + ABS(local_408 - *pdVar1);
    pdVar1 = taylor<double,_1,_6>::operator[](t1,i);
    local_3c8 = *pdVar1;
    uStack_3c0 = 0;
    pdVar1 = taylor<double,_1,_6>::operator[](t2,i);
    if (local_3f0 < local_408 / (ABS(local_3c8 + *pdVar1) * 0.5 + 1.0)) break;
    i = i + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"Difference in coefficient ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,i);
  std::operator<<(poVar2,". Correct:");
  pdVar1 = taylor<double,_1,_6>::operator[](t1,i);
  poVar2 = std::ostream::_M_insert<double>(*pdVar1);
  std::operator<<(poVar2,", taylor:");
  pdVar1 = taylor<double,_1,_6>::operator[](t2,i);
  poVar2 = std::ostream::_M_insert<double>(*pdVar1);
  std::operator<<(poVar2," difference: ");
  pdVar1 = taylor<double,_1,_6>::operator[](t1,i);
  local_408 = *pdVar1;
  pdVar1 = taylor<double,_1,_6>::operator[](t2,i);
  std::ostream::_M_insert<double>(local_408 - *pdVar1);
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__cxx11::string::string((string *)&local_3e8,"Taylor fatal error.\n",&local_409);
  poVar2 = std::operator<<((ostream *)local_310,(string *)&local_3e8);
  std::__cxx11::string::string(local_330," In function ",&local_40a);
  poVar2 = std::operator<<(poVar2,local_330);
  std::__cxx11::string::string(local_350,"taylor_compare",&local_40b);
  poVar2 = std::operator<<(poVar2,local_350);
  std::__cxx11::string::string(local_370," at line ",&local_40c);
  poVar2 = std::operator<<(poVar2,local_370);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x9d);
  std::__cxx11::string::string(local_390," of file ",&local_40d);
  poVar2 = std::operator<<(poVar2,local_390);
  std::__cxx11::string::string
            (local_3b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/tests/unittest_taylor.cpp"
             ,&local_40e);
  poVar2 = std::operator<<(poVar2,local_3b0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::stringbuf::str();
  message_and_die(&local_3e8,(ostringstream *)local_198);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int taylor_compare(const taylor<T, Nvar, Ndeg> & t1,
                   const taylor<T, Nvar, Ndeg> & t2,
                   num_t thres) {
  int nfail = 0;
  for (int i = 0; i < t1.size; i++) {
    T err = 2 * std::abs(t1[i] - t2[i]) / (1 + 0.5 * std::abs(t1[i] + t2[i]));
    if (err > thres) {
      std::ostringstream message;
      message << "Difference in coefficient " << i << ". Correct:" << t1[i]
              << ", taylor:" << t2[i] << " difference: " << t1[i] - t2[i];
      TAYLOR_ERROR(message);
      nfail++;
    }
  }
  return nfail;
}